

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::
apply(Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *__return_storage_ptr__,
     Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
     *subParser,ParserInput *input)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  size_t newSize;
  ParserInput subInput;
  Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_b8;
  ParserInput local_98;
  char local_70;
  Orphan<capnp::compiler::Token> *local_68;
  size_t local_60;
  ArrayDisposer *pAStack_58;
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_50;
  
  local_b8.builder.ptr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  local_b8.builder.pos = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  local_b8.builder.endPtr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  do {
    pcVar3 = (input->super_IteratorInput<char,_const_char_*>).pos;
    pcVar1 = (input->super_IteratorInput<char,_const_char_*>).end;
    if (pcVar3 == pcVar1) break;
    local_98.begin = input->begin;
    local_98.super_IteratorInput<char,_const_char_*>.parent =
         &input->super_IteratorInput<char,_const_char_*>;
    local_98.super_IteratorInput<char,_const_char_*>.pos = pcVar3;
    local_98.super_IteratorInput<char,_const_char_*>.end = pcVar1;
    local_98.super_IteratorInput<char,_const_char_*>.best = pcVar3;
    Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>(&local_50,subParser,&local_98);
    bVar2 = local_50.ptr.isSet;
    local_70 = local_50.ptr.isSet;
    if (local_50.ptr.isSet == true) {
      local_68 = local_50.ptr.field_1.value.ptr;
      local_60 = local_50.ptr.field_1.value.size_;
      pAStack_58 = local_50.ptr.field_1.value.disposer;
      ((IteratorInput<char,_const_char_*> *)
      &(local_98.super_IteratorInput<char,_const_char_*>.parent)->parent)->pos =
           local_98.super_IteratorInput<char,_const_char_*>.pos;
      if (local_b8.builder.pos == local_b8.builder.endPtr) {
        newSize = ((long)local_b8.builder.pos - (long)local_b8.builder.ptr >> 3) *
                  0x5555555555555556;
        if (local_b8.builder.pos == local_b8.builder.ptr) {
          newSize = 4;
        }
        Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::setCapacity(&local_b8,newSize);
      }
      (local_b8.builder.pos)->ptr = local_68;
      (local_b8.builder.pos)->size_ = local_60;
      (local_b8.builder.pos)->disposer = pAStack_58;
      local_b8.builder.pos = local_b8.builder.pos + 1;
    }
    if ((ParserInput *)local_98.super_IteratorInput<char,_const_char_*>.parent != (ParserInput *)0x0
       ) {
      pcVar3 = local_98.super_IteratorInput<char,_const_char_*>.best;
      if (local_98.super_IteratorInput<char,_const_char_*>.best <
          local_98.super_IteratorInput<char,_const_char_*>.pos) {
        pcVar3 = local_98.super_IteratorInput<char,_const_char_*>.pos;
      }
      pcVar1 = ((IteratorInput<char,_const_char_*> *)
               &(local_98.super_IteratorInput<char,_const_char_*>.parent)->parent)->best;
      if (pcVar3 <= pcVar1) {
        pcVar3 = pcVar1;
      }
      ((IteratorInput<char,_const_char_*> *)
      &(local_98.super_IteratorInput<char,_const_char_*>.parent)->parent)->best = pcVar3;
    }
  } while (bVar2 != false);
  if (local_b8.builder.pos != local_b8.builder.endPtr) {
    Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::setCapacity
              (&local_b8,
               ((long)local_b8.builder.pos - (long)local_b8.builder.ptr >> 3) * -0x5555555555555555)
    ;
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = local_b8.builder.ptr;
  (__return_storage_ptr__->ptr).field_1.value.size_ =
       ((long)local_b8.builder.pos - (long)local_b8.builder.ptr >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->ptr).field_1.value.disposer = local_b8.builder.disposer;
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }